

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typecheck.h
# Opt level: O3

kNode * TypeCheckNodeAt(KonohaContext *kctx,kNode *node,size_t pos,kNameSpace *ns,KClass *reqClass,
                       int pol)

{
  kArray *pkVar1;
  kNode *expr;
  kNode *pkVar2;
  
  pkVar1 = (node->field_5).NodeList;
  if (((pkVar1->h).ct)->baseTypeId != 6) {
    __assert_fail("((((node->NodeList)->h.ct)->baseTypeId) == KType_Array)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
                  ,0xae,
                  "kNode *TypeCheckNodeAt(KonohaContext *, kNode *, size_t, kNameSpace *, KClass *, int)"
                 );
  }
  if (pos < pkVar1->bytesize >> 3) {
    expr = (kNode *)(pkVar1->field_2).unboxItems[pos];
    pkVar2 = TypeCheckNode(kctx,expr,ns,reqClass,pol);
    if (pkVar2 != expr) {
      (*(kctx->platApi->GCModule).UpdateObjectField)
                ((kObjectVar *)(node->field_5).NodeList,
                 (kObjectVar *)
                 (&((((kObjectVar *)(node->field_5).NodeList)->field_1).fieldObjectItems[1]->h).
                   magicflag)[pos],(kObjectVar *)pkVar2);
      (((node->field_5).NodeList)->field_2).unboxItems[pos] = (uintptr_t)pkVar2;
      (*(kctx->platApi->GCModule).UpdateObjectField)
                ((kObjectVar *)pkVar2,(kObjectVar *)(pkVar2->field_3).Parent,(kObjectVar *)node);
      (pkVar2->field_3).Parent = node;
    }
    return pkVar2;
  }
  __assert_fail("pos < (((node->NodeList)->bytesize)/sizeof(void *))",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
                ,0xaf,
                "kNode *TypeCheckNodeAt(KonohaContext *, kNode *, size_t, kNameSpace *, KClass *, int)"
               );
}

Assistant:

static kNode *TypeCheckNodeAt(KonohaContext *kctx, kNode *node, size_t pos, kNameSpace *ns, KClass *reqClass, int pol)
{
	DBG_ASSERT(IS_Array(node->NodeList));
	DBG_ASSERT(pos < kArray_size(node->NodeList));
	kNode *expr = node->NodeList->NodeItems[pos];
	//kNode_SetParent(kctx, expr, node);
	//DBG_ASSERT(kNode_GetParentNULL(expr) == node);
	kNode *texpr = TypeCheckNode(kctx, expr, ns, reqClass, pol);
	if(texpr != expr) {
		KFieldSet(node->NodeList, node->NodeList->NodeItems[pos], texpr);
		kNode_SetParent(kctx, texpr, node);
	}
	return texpr;
}